

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

ExtTypeVTable * tvm::runtime::ExtTypeVTable::Get(int type_code)

{
  ostringstream *poVar1;
  ostream *poVar2;
  LogMessageFatal local_340;
  reference local_1b8;
  ExtTypeVTable *vt;
  Manager *m;
  LogMessageFatal local_198;
  int local_c;
  int type_code_local;
  
  local_c = type_code;
  if ((type_code < 0x10) || (0x7f < type_code)) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
               ,0x75);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_198);
    poVar2 = std::operator<<((ostream *)poVar1,
                             "Check failed: type_code > kExtBegin && type_code < kExtEnd");
    std::operator<<(poVar2,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_198);
  }
  vt = (ExtTypeVTable *)Registry::Manager::Global();
  local_1b8 = std::array<tvm::runtime::ExtTypeVTable,_128UL>::operator[]
                        (&((Manager *)vt)->ext_vtable,(long)local_c);
  if (local_1b8->destroy == (_func_void_void_ptr *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_340,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
               ,0x78);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_340);
    poVar2 = std::operator<<((ostream *)poVar1,"Check failed: vt->destroy != nullptr");
    poVar2 = std::operator<<(poVar2,": ");
    std::operator<<(poVar2,"Extension type not registered");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_340);
  }
  return local_1b8;
}

Assistant:

ExtTypeVTable *ExtTypeVTable::Get(int type_code) {
  CHECK(type_code > kExtBegin && type_code < kExtEnd);
  Registry::Manager *m = Registry::Manager::Global();
  ExtTypeVTable *vt = &(m->ext_vtable[type_code]);
  CHECK(vt->destroy != nullptr)
      << "Extension type not registered";
  return vt;
}